

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.c
# Opt level: O2

void test_array_expand(void)

{
  uint __line;
  int iVar1;
  char *__assertion;
  bool bVar2;
  int elm;
  cf_array_t arr;
  
  elm = 0x4d2;
  iVar1 = 5;
  cf_array_init(&arr,4,5);
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    cf_array_insert(&arr,-1,&elm,4);
  }
  if (arr.elm_count == 5) {
    if (arr.capacity == 5) {
      cf_array_insert(&arr,-1,&elm,4);
      if (arr.capacity == 10) {
        cf_array_deinit(&arr);
        return;
      }
      __assertion = "arr.capacity == 10";
      __line = 0x18;
    }
    else {
      __assertion = "arr.capacity == 5";
      __line = 0x16;
    }
  }
  else {
    __assertion = "((&arr)->elm_count) == 5";
    __line = 0x15;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                ,__line,"void test_array_expand()");
}

Assistant:

void test_array_expand() {
    cf_array_t arr;
    int i;
    int elm = 1234;
    cf_array_init(&arr, sizeof(int), 5);

    for (i = 0; i < 5; i++) {
        cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    }
    cf_assert(cf_array_size(&arr) == 5);
    cf_assert(arr.capacity == 5);
    cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    cf_assert(arr.capacity == 10);

    cf_array_deinit(&arr);
}